

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_protocol.cc
# Opt level: O1

session * __thiscall
helix::nasdaq::nordic_itch_protocol::new_session(nordic_itch_protocol *this,void *data)

{
  int iVar1;
  session *psVar2;
  invalid_argument *this_00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __rhs = &this->_name;
  iVar1 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar1 == 0) {
    psVar2 = (session *)operator_new(0x120);
    psVar2->_data = data;
    psVar2->_vptr_session = (_func_int **)&PTR__moldudp_session_00120bd0;
    nordic_itch_handler::nordic_itch_handler((nordic_itch_handler *)(psVar2 + 1));
    *(undefined4 *)&psVar2[0x11]._data = 1;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar1 != 0) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"unknown protocol: ",__rhs);
      std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    psVar2 = (session *)operator_new(0x118);
    psVar2->_data = data;
    psVar2->_vptr_session = (_func_int **)&PTR__soupfile_session_00120c58;
    nordic_itch_handler::nordic_itch_handler((nordic_itch_handler *)(psVar2 + 1));
  }
  return psVar2;
}

Assistant:

session* nordic_itch_protocol::new_session(void *data)
{
    if (_name == "nasdaq-nordic-moldudp-itch") {
        return new moldudp_session<nordic_itch_handler>(data);
    } else if (_name == "nasdaq-nordic-soupfile-itch") {
        return new soupfile_session<nordic_itch_handler>(data);
    } else {
        throw std::invalid_argument("unknown protocol: " + _name);
    }
}